

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fShaderBuiltinVarTests.cpp
# Opt level: O0

int __thiscall
deqp::gles2::Functional::ShaderDepthRangeTest::init(ShaderDepthRangeTest *this,EVP_PKEY_CTX *ctx)

{
  int iVar1;
  ostream *poVar2;
  char *pcVar3;
  string *ctx_00;
  bool local_1e2;
  allocator<char> local_1e1;
  string local_1e0 [38];
  byte local_1ba;
  allocator<char> local_1b9;
  string local_1b8 [48];
  undefined1 local_188 [8];
  ostringstream src;
  ShaderDepthRangeTest *this_local;
  
  src._368_8_ = this;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_188);
  if (((this->super_ShaderRenderCase).m_isVertexCase & 1U) != 0) {
    poVar2 = std::operator<<((ostream *)local_188,"attribute highp vec4 a_position;\n");
    std::operator<<(poVar2,"varying mediump vec4 v_color;\n");
  }
  std::operator<<((ostream *)local_188,"void main (void)\n{\n");
  poVar2 = std::operator<<((ostream *)local_188,"\t");
  pcVar3 = "gl_FragColor";
  if (((this->super_ShaderRenderCase).m_isVertexCase & 1U) != 0) {
    pcVar3 = "v_color";
  }
  poVar2 = std::operator<<(poVar2,pcVar3);
  std::operator<<(poVar2,
                  " = vec4(gl_DepthRange.near, gl_DepthRange.far, gl_DepthRange.diff*0.5 + 0.5, 1.0);\n"
                 );
  if (((this->super_ShaderRenderCase).m_isVertexCase & 1U) != 0) {
    std::operator<<((ostream *)local_188,"\tgl_Position = a_position;\n");
  }
  std::operator<<((ostream *)local_188,"}\n");
  pcVar3 = init::defaultVertSrc;
  local_1ba = 0;
  if (((this->super_ShaderRenderCase).m_isVertexCase & 1U) == 0) {
    std::allocator<char>::allocator();
    local_1ba = 1;
    std::__cxx11::string::string<std::allocator<char>>(local_1b8,pcVar3,&local_1b9);
  }
  else {
    std::__cxx11::ostringstream::str();
  }
  std::__cxx11::string::operator=
            ((string *)&(this->super_ShaderRenderCase).m_vertShaderSource,local_1b8);
  std::__cxx11::string::~string(local_1b8);
  if ((local_1ba & 1) != 0) {
    std::allocator<char>::~allocator(&local_1b9);
  }
  pcVar3 = init::defaultFragSrc;
  local_1e2 = ((this->super_ShaderRenderCase).m_isVertexCase & 1U) == 0;
  if (local_1e2) {
    std::__cxx11::ostringstream::str();
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(local_1e0,pcVar3,&local_1e1);
  }
  local_1e2 = !local_1e2;
  ctx_00 = local_1e0;
  std::__cxx11::string::operator=
            ((string *)&(this->super_ShaderRenderCase).m_fragShaderSource,ctx_00);
  std::__cxx11::string::~string(local_1e0);
  if (local_1e2) {
    std::allocator<char>::~allocator(&local_1e1);
  }
  deqp::gls::ShaderRenderCase::init(&this->super_ShaderRenderCase,(EVP_PKEY_CTX *)ctx_00);
  iVar1 = std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_188);
  return iVar1;
}

Assistant:

void init (void)
	{
		static const char* defaultVertSrc =
			"attribute highp vec4 a_position;\n"
			"void main (void)\n"
			"{\n"
			"	gl_Position = a_position;\n"
			"}\n";
		static const char* defaultFragSrc =
			"varying mediump vec4 v_color;\n\n"
			"void main (void)\n"
			"{\n"
			"	gl_FragColor = v_color;\n"
			"}\n";

		// Construct shader.
		std::ostringstream src;
		if (m_isVertexCase)
			src << "attribute highp vec4 a_position;\n"
				<< "varying mediump vec4 v_color;\n";

		src << "void main (void)\n{\n";
		src << "\t" << (m_isVertexCase ? "v_color" : "gl_FragColor") << " = vec4(gl_DepthRange.near, gl_DepthRange.far, gl_DepthRange.diff*0.5 + 0.5, 1.0);\n";

		if (m_isVertexCase)
			src << "\tgl_Position = a_position;\n";

		src << "}\n";

		m_vertShaderSource		= m_isVertexCase ? src.str()		: defaultVertSrc;
		m_fragShaderSource		= m_isVertexCase ? defaultFragSrc	: src.str();

		gls::ShaderRenderCase::init();
	}